

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

Iterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::Erase(Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
        *this,ConstIterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> from,
       ConstIterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> to)

{
  CordRep *pCVar1;
  Iterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar2;
  Iterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> extraout_RAX;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> this_00;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar7;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar8;
  ConstIterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> assign_at;
  Payload *pPVar9;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  move_values;
  Metadata local_38;
  
  uVar4 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if ((uVar4 & 1) == 0) {
    pSVar7 = (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
              *)&this->data_;
  }
  else {
    pSVar7 = (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
              *)(this->data_).allocated.allocated_data;
  }
  uVar4 = uVar4 >> 1;
  lVar5 = (long)to - (long)from >> 4;
  uVar6 = lVar5 * -0x5555555555555555;
  lVar3 = ((long)from - (long)pSVar7 >> 4) * -0x5555555555555555 + uVar6;
  local_38.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value =
       (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )((move_iterator<absl::lts_20250127::status_internal::Payload_*> *)&pSVar7->metadata_ +
         lVar3 * 6);
  lVar3 = uVar4 - lVar3;
  this_00 = from;
  pSVar8 = pSVar7;
  if (lVar3 != 0) {
    assign_at = from;
    do {
      this_00 = assign_at;
      pSVar8 = (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                *)&local_38;
      IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
      ::AssignNext((IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
                    *)&local_38,assign_at);
      assign_at = assign_at + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (to != from) {
    pPVar9 = (Payload *)
             ((move_iterator<absl::lts_20250127::status_internal::Payload_*> *)&pSVar7->metadata_ +
             uVar4 * 6);
    uVar4 = uVar6;
    do {
      pPVar9 = pPVar9 + -1;
      this_00 = pPVar9;
      pSVar8 = this;
      __gnu_cxx::new_allocator<absl::lts_20250127::status_internal::Payload>::
      destroy<absl::lts_20250127::status_internal::Payload>
                ((new_allocator<absl::lts_20250127::status_internal::Payload> *)this,pPVar9);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  uVar4 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (uVar6 <= uVar4 >> 1) {
    (this->metadata_).
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value = uVar4 + lVar5 * -0x5555555555555556;
    return from;
  }
  Storage<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>
  ::Erase();
  pPVar9 = ((move_iterator<absl::lts_20250127::status_internal::Payload_*> *)&pSVar8->metadata_)->
           _M_current;
  pPVar2 = (Iterator<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
           std::__cxx11::string::operator=((string *)this_00,(string *)pPVar9);
  if (((this_00->payload).contents_.data_.rep_.field_0.data[0] & 1U) != 0) {
    Cord::InlineRep::UnrefTree(&(this_00->payload).contents_);
    pPVar2 = extraout_RAX;
  }
  pCVar1 = (pPVar9->payload).contents_.data_.rep_.field_0.as_tree.rep;
  (this_00->payload).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (pPVar9->payload).contents_.data_.rep_.field_0.as_tree.cordz_info;
  (this_00->payload).contents_.data_.rep_.field_0.as_tree.rep = pCVar1;
  (pPVar9->payload).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
  (pPVar9->payload).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  ((move_iterator<absl::lts_20250127::status_internal::Payload_*> *)&pSVar8->metadata_)->_M_current
       = ((move_iterator<absl::lts_20250127::status_internal::Payload_*> *)&pSVar8->metadata_)->
         _M_current + 1;
  return pPVar2;
}

Assistant:

auto Storage<T, N, A>::Erase(ConstIterator<A> from,
                             ConstIterator<A> to) -> Iterator<A> {
  StorageView<A> storage_view = MakeStorageView();

  auto erase_size = static_cast<SizeType<A>>(std::distance(from, to));
  auto erase_index = static_cast<SizeType<A>>(
      std::distance(ConstIterator<A>(storage_view.data), from));
  SizeType<A> erase_end_index = erase_index + erase_size;

  // Fast path: if the value type is trivially relocatable and we know
  // the allocator doesn't do anything fancy, then we know it is legal for us to
  // simply destroy the elements in the "erasure window" (which cannot throw)
  // and then memcpy downward to close the window.
  if (absl::is_trivially_relocatable<ValueType<A>>::value &&
      std::is_nothrow_destructible<ValueType<A>>::value &&
      std::is_same<A, std::allocator<ValueType<A>>>::value) {
    DestroyAdapter<A>::DestroyElements(
        GetAllocator(), storage_view.data + erase_index, erase_size);
    std::memmove(
        reinterpret_cast<char*>(storage_view.data + erase_index),
        reinterpret_cast<const char*>(storage_view.data + erase_end_index),
        (storage_view.size - erase_end_index) * sizeof(ValueType<A>));
  } else {
    IteratorValueAdapter<A, MoveIterator<A>> move_values(
        MoveIterator<A>(storage_view.data + erase_end_index));

    AssignElements<A>(storage_view.data + erase_index, move_values,
                      storage_view.size - erase_end_index);

    DestroyAdapter<A>::DestroyElements(
        GetAllocator(), storage_view.data + (storage_view.size - erase_size),
        erase_size);
  }
  SubtractSize(erase_size);
  return Iterator<A>(storage_view.data + erase_index);
}